

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdFinalizeMultisigScript
              (void *handle,void *multisig_handle,uint32_t require_num,char **address,
              char **redeem_script,char **witness_script)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  char *pcVar5;
  Script *this;
  ulong uVar6;
  bool is_bitcoin;
  AddressType local_488;
  NetType local_484;
  char *work_redeem_script;
  char *work_address;
  void *local_470;
  undefined8 local_468;
  uint32_t local_45c;
  char **local_458;
  char **local_450;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  AddressFactory factory;
  Script redeem_script_obj;
  Script multisig_script;
  Script witness_script_obj;
  Address local_358;
  Script script;
  Address addr;
  
  work_address = (char *)0x0;
  work_redeem_script = (char *)0x0;
  local_468 = 0;
  local_470 = handle;
  local_45c = require_num;
  local_458 = witness_script;
  local_450 = redeem_script;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&addr,"MultisigScript",(allocator *)&local_358);
  cfd::capi::CheckBuffer(multisig_handle,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  if (*(uint *)((long)multisig_handle + 0xa54) == 0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x134;
    addr.address_._M_dataplus._M_p = "CfdFinalizeMultisigScript";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"pubkey not found.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. pubkey not found.",(allocator *)&local_358);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&addr);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (0x14 < *(uint *)((long)multisig_handle + 0xa54)) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x13b;
    addr.address_._M_dataplus._M_p = "CfdFinalizeMultisigScript";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&addr,"The number of pubkey has reached the upper limit.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"The number of pubkey has reached the upper limit.",
               (allocator *)&local_358);
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)&addr);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  local_484 = cfd::capi::ConvertNetType(*(int *)((long)multisig_handle + 0x10),&is_bitcoin);
  cfd::core::Address::Address(&addr);
  local_488 = cfd::capi::ConvertHashToAddressType(*(int *)((long)multisig_handle + 0x14));
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&script);
  cfd::core::Script::Script(&redeem_script_obj);
  cfd::core::Script::Script(&witness_script_obj);
  pcVar5 = (char *)((long)multisig_handle + 0x18);
  for (uVar6 = 0; uVar6 < *(uint *)((long)multisig_handle + 0xa54); uVar6 = uVar6 + 1) {
    std::__cxx11::string::string((string *)&local_358,pcVar5,(allocator *)&multisig_script);
    std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>> *)&pubkeys,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    pcVar5 = pcVar5 + 0x83;
  }
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&multisig_script,local_45c,&pubkeys,local_488 != kP2shAddress);
  if (is_bitcoin == true) {
    cfd::AddressFactory::AddressFactory(&factory,local_484);
    cfd::AddressFactory::CreateAddress
              (&local_358,&factory,local_488,(Pubkey *)0x0,&multisig_script,(Script *)0x0,
               &redeem_script_obj);
    cfd::core::Address::operator=(&addr,&local_358);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory
              ((ElementsAddressFactory *)&factory,local_484);
    cfd::AddressFactory::CreateAddress
              (&local_358,&factory,local_488,(Pubkey *)0x0,&multisig_script,(Script *)0x0,
               &redeem_script_obj);
    cfd::core::Address::operator=(&addr,&local_358);
  }
  cfd::core::Address::~Address(&local_358);
  cfd::AddressFactory::~AddressFactory(&factory);
  this = &redeem_script_obj;
  if (local_488 != kP2shAddress) {
    this = &witness_script_obj;
  }
  cfd::core::Script::operator=(this,&multisig_script);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_358,&addr);
  pcVar5 = cfd::capi::CreateString((string *)&local_358);
  work_address = pcVar5;
  std::__cxx11::string::~string((string *)&local_358);
  if (local_450 == (char **)0x0) {
LAB_00352c15:
    pcVar2 = (char *)0x0;
  }
  else {
    bVar1 = cfd::core::Script::IsEmpty(&redeem_script_obj);
    if (bVar1) goto LAB_00352c15;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_358,&redeem_script_obj);
    pcVar2 = cfd::capi::CreateString((string *)&local_358);
    work_redeem_script = pcVar2;
    std::__cxx11::string::~string((string *)&local_358);
  }
  if (local_458 != (char **)0x0) {
    bVar1 = cfd::core::Script::IsEmpty(&witness_script_obj);
    if (!bVar1) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&local_358,&witness_script_obj);
      pcVar3 = cfd::capi::CreateString((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      goto LAB_00352ca1;
    }
  }
  pcVar3 = (char *)0x0;
LAB_00352ca1:
  *address = pcVar5;
  if (pcVar2 != (char *)0x0) {
    *local_450 = pcVar2;
  }
  if (pcVar3 != (char *)0x0) {
    *local_458 = pcVar3;
  }
  cfd::core::Script::~Script(&multisig_script);
  cfd::core::Script::~Script(&witness_script_obj);
  cfd::core::Script::~Script(&redeem_script_obj);
  cfd::core::Script::~Script(&script);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::core::Address::~Address(&addr);
  return 0;
}

Assistant:

int CfdFinalizeMultisigScript(
    void* handle, void* multisig_handle, uint32_t require_num, char** address,
    char** redeem_script, char** witness_script) {
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_witness_script = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "pubkey not found.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey not found.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    bool is_bitcoin = false;
    NetType net_type =
        cfd::capi::ConvertNetType(data->network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(data->hash_type);
    std::vector<Pubkey> pubkeys;
    Script script;
    Script redeem_script_obj;
    Script witness_script_obj;

    for (uint32_t index = 0; index < data->current_index; ++index) {
      pubkeys.emplace_back(std::string(data->pubkeys[index]));
    }
    bool has_witness = (addr_type != AddressType::kP2shAddress);
    Script multisig_script = ScriptUtil::CreateMultisigRedeemScript(
        require_num, pubkeys, has_witness);

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (!has_witness) {
      redeem_script_obj = multisig_script;
    } else {
      witness_script_obj = multisig_script;
    }

    work_address = CreateString(addr.GetAddress());
    if (redeem_script != nullptr) {
      if (!redeem_script_obj.IsEmpty()) {
        work_redeem_script = CreateString(redeem_script_obj.GetHex());
      }
    }
    if (witness_script != nullptr) {
      if (!witness_script_obj.IsEmpty()) {
        work_witness_script = CreateString(witness_script_obj.GetHex());
      }
    }

    *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_witness_script != nullptr) *witness_script = work_witness_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}